

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary.cc
# Opt level: O1

void __thiscall
ctemplate::TemplateDictionary::SetValue
          (TemplateDictionary *this,TemplateString variable,TemplateString value)

{
  UnsafeArena *pUVar1;
  small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
  *m;
  TemplateString value_00;
  VariableDict *pVVar2;
  TemplateString local_40;
  
  if (this->variable_dict_ == (VariableDict *)0x0) {
    pVVar2 = (VariableDict *)BaseArena::GetMemory(&this->arena_->super_BaseArena,0xb0,8);
    pUVar1 = this->arena_;
    pVVar2->size_ = 0;
    (pVVar2->functor_).arena_ = pUVar1;
    this->variable_dict_ = pVVar2;
  }
  m = this->variable_dict_;
  Memdup(&local_40,this,&value);
  value_00.length_ = local_40.length_;
  value_00.ptr_ = local_40.ptr_;
  value_00.is_immutable_ = local_40.is_immutable_;
  value_00._17_7_ = local_40._17_7_;
  value_00.id_ = local_40.id_;
  HashInsert<ctemplate::small_map<std::map<unsigned_long,ctemplate::TemplateString,std::less<unsigned_long>,ctemplate::ArenaAllocator<std::pair<unsigned_long_const,ctemplate::TemplateString>,ctemplate::UnsafeArena>>,4,std::equal_to<unsigned_long>,ctemplate::TemplateDictionary::map_arena_init>,ctemplate::TemplateString>
            (m,variable,value_00);
  return;
}

Assistant:

void TemplateDictionary::SetValue(const TemplateString variable,
                                  const TemplateString value) {
  LazilyCreateDict(&variable_dict_);
  HashInsert(variable_dict_, variable, Memdup(value));
}